

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console.cpp
# Opt level: O0

int __thiscall
CConsole::PossibleMaps(CConsole *this,char *pStr,FPossibleCallback pfnCallback,void *pUser)

{
  char *pcVar1;
  char *in_RCX;
  code *in_RDX;
  long in_RDI;
  CMapListEntryTemp *pMapEntry;
  int Index;
  undefined8 local_30;
  undefined4 local_24;
  
  local_24 = 0;
  for (local_30 = *(long *)(in_RDI + 0xe8); local_30 != 0; local_30 = *(long *)(local_30 + 8)) {
    pcVar1 = str_find_nocase((char *)in_RDX,in_RCX);
    if (pcVar1 != (char *)0x0) {
      (*in_RDX)(local_24,local_30 + 0x10,in_RCX);
      local_24 = local_24 + 1;
    }
  }
  return local_24;
}

Assistant:

int CConsole::PossibleMaps(const char *pStr, FPossibleCallback pfnCallback, void *pUser)
{
	int Index = 0;
	for(CMapListEntryTemp *pMapEntry = m_pFirstMapEntry; pMapEntry; pMapEntry = pMapEntry->m_pNext)
	{
		if(str_find_nocase(pMapEntry->m_aName, pStr))
		{
			pfnCallback(Index, pMapEntry->m_aName, pUser);
			Index++;
		}
	}
	return Index;
}